

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.hpp
# Opt level: O1

void __thiscall
asio::detail::object_pool<asio::detail::epoll_reactor::descriptor_state>::~object_pool
          (object_pool<asio::detail::epoll_reactor::descriptor_state> *this)

{
  descriptor_state *pdVar1;
  descriptor_state *pdVar2;
  
  pdVar2 = this->live_list_;
  while (pdVar2 != (descriptor_state *)0x0) {
    pdVar1 = pdVar2->next_;
    object_pool_access::destroy<asio::detail::epoll_reactor::descriptor_state>(pdVar2);
    pdVar2 = pdVar1;
  }
  pdVar2 = this->free_list_;
  while (pdVar2 != (descriptor_state *)0x0) {
    pdVar1 = pdVar2->next_;
    object_pool_access::destroy<asio::detail::epoll_reactor::descriptor_state>(pdVar2);
    pdVar2 = pdVar1;
  }
  return;
}

Assistant:

~object_pool()
  {
    destroy_list(live_list_);
    destroy_list(free_list_);
  }